

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.cc
# Opt level: O0

void __thiscall
S2CellIndex::GetIntersectingLabels
          (S2CellIndex *this,S2CellUnion *target,vector<int,_std::allocator<int>_> *labels)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  const_iterator local_90;
  int *local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  const_iterator local_70;
  int *local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  anon_class_8_1_5ef4513d local_48;
  CellVisitor local_40;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *labels_local;
  S2CellUnion *target_local;
  S2CellIndex *this_local;
  
  local_20 = labels;
  labels_local = (vector<int,_std::allocator<int>_> *)target;
  target_local = (S2CellUnion *)this;
  std::vector<int,_std::allocator<int>_>::clear(labels);
  pvVar1 = labels_local;
  local_48.labels = local_20;
  std::function<bool(S2CellId,int)>::
  function<S2CellIndex::GetIntersectingLabels(S2CellUnion_const&,std::vector<int,std::allocator<int>>*)const::__0,void>
            ((function<bool(S2CellId,int)> *)&local_40,&local_48);
  VisitIntersectingCells(this,(S2CellUnion *)pvVar1,&local_40);
  std::function<bool_(S2CellId,_int)>::~function(&local_40);
  local_60._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(local_20);
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::end(local_20);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (local_60,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_68);
  pvVar1 = local_20;
  local_80._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(local_20);
  local_88 = (int *)std::vector<int,_std::allocator<int>_>::end(local_20);
  local_78 = std::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (local_80,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                                 local_88);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_70,
             &local_78);
  local_98._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(local_20);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_90,
             &local_98);
  std::vector<int,_std::allocator<int>_>::erase(pvVar1,local_70,local_90);
  return;
}

Assistant:

void S2CellIndex::GetIntersectingLabels(const S2CellUnion& target,
                                        std::vector<Label>* labels) const {
  labels->clear();
  VisitIntersectingCells(target, [labels](S2CellId cell_id, Label label) {
      labels->push_back(label);
      return true;
    });
  std::sort(labels->begin(), labels->end());
  labels->erase(std::unique(labels->begin(), labels->end()), labels->end());
}